

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_BackUpReusesPartialBuffer_Test::TestBody
          (CordOutputStreamTest_BackUpReusesPartialBuffer_Test *this)

{
  undefined1 auVar1 [8];
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar3;
  pointer pcVar4;
  AlphaNum *in_R9;
  pointer *__ptr;
  int size;
  string_view fragment;
  void *data;
  Cord cord;
  CordOutputStream output;
  int local_1fc;
  undefined1 local_1f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [2];
  undefined1 local_1c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  char *local_198;
  AlphaNum local_190;
  undefined1 local_160 [8];
  undefined1 local_158 [8];
  AlphaNum local_150;
  internal local_120 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  long *local_110;
  CordRep *local_108;
  long local_100 [2];
  long *local_f0;
  long *local_e8;
  long local_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [24];
  Cord local_88 [2];
  byte local_68;
  undefined7 uStack_67;
  string local_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  CordOutputStream::CordOutputStream((CordOutputStream *)(local_a0 + 0x10),2000);
  bVar2 = CordOutputStream::Next((CordOutputStream *)(local_a0 + 0x10),&local_198,&local_1fc);
  auVar1 = local_1c8;
  local_1c8[0] = bVar2;
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    local_1c8._4_4_ = auVar1._4_4_;
    local_1c8._0_4_ = 2000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_1f8,"size","2000",&local_1fc,(int *)local_1c8);
    if (local_1f8[0] != (internal)0x0) {
      if (pbStack_1f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_1f0,pbStack_1f0);
      }
      builtin_strncpy(local_198,
                      "1111111111111111111111111111111111111111111111111111111111111111111111111111111111111111111111111111"
                      ,100);
      CordOutputStream::BackUp((CordOutputStream *)(local_a0 + 0x10),0x76c);
      bVar2 = CordOutputStream::Next((CordOutputStream *)(local_a0 + 0x10),&local_198,&local_1fc);
      auVar1 = local_1c8;
      local_1c8[0] = bVar2;
      local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_190);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1f8,(internal *)local_1c8,
                   (AssertionResult *)"output.Next(&data, &size)","false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(local_158 + 8),kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x4bd,(char *)local_1f8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(local_158 + 8),(Message *)&local_190);
        goto LAB_00b4149f;
      }
      local_1c8._4_4_ = auVar1._4_4_;
      local_1c8._0_4_ = 0x76c;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_1f8,"size","1900",&local_1fc,(int *)local_1c8);
      if (local_1f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1c8);
        if (pbStack_1f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar4 = (pbStack_1f0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_190,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x4be,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1c8);
        goto LAB_00b415a4;
      }
      if (pbStack_1f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_1f0,pbStack_1f0);
      }
      memset(local_198,0x32,200);
      CordOutputStream::BackUp((CordOutputStream *)(local_a0 + 0x10),0x6a4);
      bVar2 = CordOutputStream::Next((CordOutputStream *)(local_a0 + 0x10),&local_198,&local_1fc);
      auVar1 = local_1c8;
      local_1c8[0] = bVar2;
      local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_190);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1f8,(internal *)local_1c8,
                   (AssertionResult *)"output.Next(&data, &size)","false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(local_158 + 8),kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x4c2,(char *)local_1f8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(local_158 + 8),(Message *)&local_190);
        goto LAB_00b4149f;
      }
      local_1c8._4_4_ = auVar1._4_4_;
      local_1c8._0_4_ = 0x6a4;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_1f8,"size","1700",&local_1fc,(int *)local_1c8);
      if (local_1f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1c8);
        if (pbStack_1f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar4 = (pbStack_1f0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_190,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x4c3,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1c8);
        goto LAB_00b415a4;
      }
      if (pbStack_1f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_1f0,pbStack_1f0);
      }
      memset(local_198,0x33,400);
      CordOutputStream::BackUp((CordOutputStream *)(local_a0 + 0x10),0x514);
      bVar2 = CordOutputStream::Next((CordOutputStream *)(local_a0 + 0x10),&local_198,&local_1fc);
      auVar1 = local_1c8;
      local_1c8[0] = bVar2;
      local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_190);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1f8,(internal *)local_1c8,
                   (AssertionResult *)"output.Next(&data, &size)","false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(local_158 + 8),kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x4c7,(char *)local_1f8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(local_158 + 8),(Message *)&local_190);
        goto LAB_00b4149f;
      }
      local_1c8._4_4_ = auVar1._4_4_;
      local_1c8._0_4_ = 0x514;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_1f8,"size","1300",&local_1fc,(int *)local_1c8);
      if (local_1f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1c8);
        if (pbStack_1f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar4 = (pbStack_1f0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_190,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x4c8,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1c8);
        goto LAB_00b415a4;
      }
      if (pbStack_1f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_1f0,pbStack_1f0);
      }
      memset(local_198,0x34,0x514);
      CordOutputStream::Consume((CordOutputStream *)local_160);
      if (local_158 == (undefined1  [8])0x0 || (local_160[0] & 1) == 0) {
LAB_00b41405:
        if (local_158 == (undefined1  [8])0x0 || (local_160[0] & 1) == 0) {
          if ((local_160[0] & 1) == 0) {
            local_38._M_len = (size_t)((ulong)(long)(char)local_160[0] >> 1);
            local_38._M_str = (char *)(local_160 + 1);
          }
          else {
            local_38._M_len = (size_t)((Nonnull<CordRep_*>)local_158)->length;
            local_38._M_str =
                 (char *)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        else {
          local_1f8 = (undefined1  [8])0x0;
          pbStack_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          absl::lts_20250127::Cord::GetFlatAux
                    ((Nonnull<CordRep_*>)local_158,(Nonnull<absl::string_view_*>)local_1f8);
          local_38._M_len = (size_t)local_1f8;
          local_38._M_str = (char *)pbStack_1f0;
        }
        local_c0.field_2._M_allocated_capacity =
             (size_type)
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
        std::__cxx11::string::_M_construct((ulong)&local_c0.field_2,'d');
        local_1f8 = (undefined1  [8])local_c0.field_2._8_8_;
        pbStack_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_c0.field_2._M_allocated_capacity;
        local_d0 = &local_c0;
        std::__cxx11::string::_M_construct((ulong)&local_d0,-0x38);
        local_1c8 = (undefined1  [8])
                    local_c8._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
        local_1c0 = local_d0;
        local_f0 = local_e0;
        std::__cxx11::string::_M_construct((ulong)&local_f0,-0x70);
        local_190.piece_._M_len = (size_t)local_e8;
        local_190.piece_._M_str = (char *)local_f0;
        local_110 = local_100;
        std::__cxx11::string::_M_construct((ulong)&local_110,'\x14');
        local_150.piece_._M_len = (size_t)local_108;
        local_150.piece_._M_str = (char *)local_110;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_58,(lts_20250127 *)local_1f8,(AlphaNum *)local_1c8,&local_190,
                   (AlphaNum *)(local_158 + 8),in_R9);
        testing::internal::
        CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                  (local_120,"flat",
                   "absl::StrCat(std::string(100, \'1\'), std::string(200, \'2\'), std::string(400, \'3\'), std::string(1300, \'4\'))"
                   ,&local_38,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if (local_110 != local_100) {
          operator_delete(local_110,local_100[0] + 1);
        }
        if (local_f0 != local_e0) {
          operator_delete(local_f0,local_e0[0] + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,(ulong)(local_c0._M_dataplus._M_p + 1));
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_c0.field_2._M_allocated_capacity !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0) {
          operator_delete((void *)local_c0.field_2._M_allocated_capacity,(ulong)(local_a0._0_8_ + 1)
                         );
        }
        if (local_120[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_1f8);
          if (local_118 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar4 = (local_118->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_1c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                     ,0x4cf,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_1c8,(Message *)local_1f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1c8);
          if (local_1f8 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_1f8 + 8))();
          }
        }
        if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pdVar3 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_118;
LAB_00b41b25:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar3,local_118);
        }
      }
      else {
        local_1f8 = (undefined1  [8])0x0;
        pbStack_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        bVar2 = absl::lts_20250127::Cord::GetFlatAux
                          ((Nonnull<CordRep_*>)local_158,(Nonnull<absl::string_view_*>)local_1f8);
        if (bVar2) goto LAB_00b41405;
        local_1c8 = (undefined1  [8])((ulong)local_1c8 & 0xffffffffffffff00);
        local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::Message::Message((Message *)&local_190);
        pdVar3 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0;
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1f8,(internal *)local_1c8,(AssertionResult *)"cord.TryFlat()",
                   "false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(local_158 + 8),kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x4cc,(char *)local_1f8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(local_158 + 8),(Message *)&local_190);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_158 + 8));
        if (local_1f8 != (undefined1  [8])local_1e8) {
          operator_delete((void *)local_1f8,local_1e8[0]._M_allocated_capacity + 1);
        }
        if ((long *)local_190.piece_._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_190.piece_._M_len + 8))();
        }
        local_118 = local_1c0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_00b41b25;
      }
      absl::lts_20250127::Cord::~Cord((Cord *)local_160);
      goto LAB_00b415d2;
    }
    testing::Message::Message((Message *)local_1c8);
    if (pbStack_1f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (pbStack_1f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x4b9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)local_1c8);
LAB_00b415a4:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if (local_1c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1c8 + 8))();
    }
    if (pbStack_1f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b415d2;
    pdVar3 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&pbStack_1f0;
    __ptr_00 = pbStack_1f0;
  }
  else {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_1c8,
               (AssertionResult *)"output.Next(&data, &size)","false","true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_158 + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x4b8,(char *)local_1f8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_158 + 8),(Message *)&local_190);
LAB_00b4149f:
    pdVar3 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1c0;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_158 + 8));
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8,local_1e8[0]._M_allocated_capacity + 1);
    }
    if ((long *)local_190.piece_._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_190.piece_._M_len + 8))();
    }
    __ptr_00 = local_1c0;
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b415d2;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar3,__ptr_00);
LAB_00b415d2:
  if ((local_68 & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete((CordRep *)CONCAT71(uStack_67,local_68));
  }
  absl::lts_20250127::Cord::~Cord(local_88);
  return;
}

Assistant:

TEST(CordOutputStreamTest, BackUpReusesPartialBuffer) {
  CordOutputStream output(2000);
  void* data;
  int size;

  ASSERT_TRUE(output.Next(&data, &size));
  ASSERT_EQ(size, 2000);
  memset(data, '1', 100);
  output.BackUp(1900);

  ASSERT_TRUE(output.Next(&data, &size));
  ASSERT_EQ(size, 1900);
  memset(data, '2', 200);
  output.BackUp(1700);

  ASSERT_TRUE(output.Next(&data, &size));
  ASSERT_EQ(size, 1700);
  memset(data, '3', 400);
  output.BackUp(1300);

  ASSERT_TRUE(output.Next(&data, &size));
  ASSERT_EQ(size, 1300);
  memset(data, '4', 1300);

  absl::Cord cord = output.Consume();
  ASSERT_TRUE(cord.TryFlat());
  absl::string_view flat = *cord.TryFlat();
  EXPECT_EQ(flat, absl::StrCat(std::string(100, '1'), std::string(200, '2'),
                               std::string(400, '3'), std::string(1300, '4')));
}